

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int __thiscall fmt::v7::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  undefined4 error_code;
  int extraout_EAX;
  char *in_RCX;
  v7 *in_RDX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  size_t in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar1;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  runtime_error local_320 [16];
  system_error *local_310;
  runtime_error *base;
  string local_2f8;
  string_view local_2d8 [2];
  allocator<char> local_2b1;
  undefined1 local_2b0 [8];
  memory_buffer buffer;
  int err_code_local;
  system_error *this_local;
  format_args args_local;
  string_view format_str_local;
  detail *local_48;
  char *local_40;
  size_t local_30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aStack_28;
  string *local_20;
  size_t *local_18;
  size_t *local_10;
  
  buffer._532_4_ = SUB84(ctx,0);
  this->error_code_ = buffer._532_4_;
  aVar1 = in_R9;
  format_str_local.data_ = in_RCX;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2b0,&local_2b1);
  std::allocator<char>::~allocator(&local_2b1);
  error_code = buffer._532_4_;
  bVar2.size_ = (size_t)&local_2f8;
  bVar2.data_ = format_str_local.data_;
  local_30 = in_R8;
  aStack_28 = in_R9;
  local_20 = &local_2f8;
  bVar2 = to_string_view<char>(in_RDX,bVar2);
  local_10 = &format_str_local.size_;
  local_18 = &local_30;
  local_48 = (detail *)bVar2.data_;
  local_40 = (char *)bVar2.size_;
  format_str.size_ = local_30;
  format_str.data_ = local_40;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = aVar1.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)aStack_28.values_;
  detail::vformat_abi_cxx11_(&local_2f8,local_48,format_str,args);
  basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            (local_2d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2f8);
  format_system_error((buffer<char> *)local_2b0,error_code,local_2d8[0]);
  std::__cxx11::string::~string((string *)&local_2f8);
  local_310 = this;
  to_string<char,500ul>(&local_340,(v7 *)local_2b0,buf);
  std::runtime_error::runtime_error(local_320,(string *)&local_340);
  std::runtime_error::operator=(&local_310->super_runtime_error,local_320);
  std::runtime_error::~runtime_error(local_320);
  std::__cxx11::string::~string((string *)&local_340);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_2b0);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}